

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int vdbeCommit(sqlite3 *db,Vdbe *p)

{
  int *piVar1;
  u8 uVar2;
  VTable **ppVVar3;
  sqlite3_vtab *pVtab;
  _func_int_sqlite3_vtab_ptr *p_Var4;
  Btree *pBVar5;
  Pager *pPVar6;
  sqlite3_vfs *pVfs;
  long lVar7;
  char *__s;
  sqlite3_file *psVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  size_t sVar13;
  char *zFile;
  char *pcVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  sqlite3_file *pSuperJrnl;
  u32 iRandom;
  int res;
  long local_60;
  sqlite3_file *local_50;
  int local_48;
  int local_44;
  uint local_40;
  int local_3c;
  sqlite3_file *local_38;
  
  ppVVar3 = db->aVTrans;
  db->aVTrans = (VTable **)0x0;
  if (db->nVTrans < 1) {
    iVar9 = 0;
  }
  else {
    lVar16 = 0;
    do {
      pVtab = ppVVar3[lVar16]->pVtab;
      iVar9 = 0;
      if ((pVtab != (sqlite3_vtab *)0x0) &&
         (p_Var4 = pVtab->pModule->xSync, p_Var4 != (_func_int_sqlite3_vtab_ptr *)0x0)) {
        iVar9 = (*p_Var4)(pVtab);
        sqlite3VtabImportErrmsg(p,pVtab);
      }
    } while ((iVar9 == 0) && (lVar16 = lVar16 + 1, lVar16 < db->nVTrans));
  }
  db->aVTrans = ppVVar3;
  if (iVar9 != 0) {
    return iVar9;
  }
  lVar16 = 0;
  lVar17 = -1;
  iVar9 = 0;
  bVar18 = false;
  while (lVar17 = lVar17 + 1, lVar17 < db->nDb) {
    pBVar5 = *(Btree **)((long)&db->aDb->pBt + lVar16);
    iVar10 = 0;
    if ((pBVar5 != (Btree *)0x0) && (pBVar5->inTrans == '\x02')) {
      if ((pBVar5->sharable != '\0') &&
         (pBVar5->wantToLock = pBVar5->wantToLock + 1, pBVar5->locked == '\0')) {
        btreeLockCarefully(pBVar5);
      }
      pPVar6 = pBVar5->pBt->pPager;
      if (((&db->aDb->safety_level)[lVar16] != '\x01') &&
         ((0x34UL >> ((ulong)pPVar6->journalMode & 0x3f) & 1) == 0)) {
        uVar12 = 0;
        if (pPVar6->tempFile == '\0') {
          uVar12 = (uint)(pPVar6->memVfs == '\0');
        }
        iVar9 = iVar9 + uVar12;
      }
      iVar10 = sqlite3PagerExclusiveLock(pPVar6);
      bVar18 = true;
      if (pBVar5->sharable != '\0') {
        piVar1 = &pBVar5->wantToLock;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          unlockBtreeMutex(pBVar5);
        }
      }
    }
    lVar16 = lVar16 + 0x20;
    if (iVar10 != 0) {
      return iVar10;
    }
  }
  if (((bVar18) && (db->xCommitCallback != (_func_int_void_ptr *)0x0)) &&
     (iVar10 = (*db->xCommitCallback)(db->pCommitArg), iVar10 != 0)) {
    return 0x213;
  }
  pPVar6 = db->aDb->pBt->pBt->pPager;
  uVar2 = pPVar6->memDb;
  if (uVar2 == '\0') {
    pcVar14 = pPVar6->zFilename;
  }
  else {
    pcVar14 = (char *)((long)&sqlite3PagerFilename_zFake + 4);
  }
  if (pcVar14 == (char *)0x0) {
    bVar18 = true;
  }
  else {
    sVar13 = strlen(pcVar14);
    bVar18 = (sVar13 & 0x3fffffff) == 0;
  }
  if ((bVar18) || (iVar9 < 2)) {
    if (db->nDb < 1) {
      iVar9 = 0;
    }
    else {
      lVar16 = 8;
      lVar17 = 0;
      do {
        pBVar5 = *(Btree **)((long)&db->aDb->zDbSName + lVar16);
        iVar9 = 0;
        if (pBVar5 != (Btree *)0x0) {
          iVar9 = sqlite3BtreeCommitPhaseOne(pBVar5,(char *)0x0);
        }
        if (iVar9 != 0) break;
        lVar17 = lVar17 + 1;
        lVar16 = lVar16 + 0x20;
      } while (lVar17 < db->nDb);
    }
    if (iVar9 != 0) {
      return iVar9;
    }
    lVar16 = -1;
    lVar17 = 8;
    while (lVar16 = lVar16 + 1, lVar16 < db->nDb) {
      pBVar5 = *(Btree **)((long)&db->aDb->zDbSName + lVar17);
      if (pBVar5 == (Btree *)0x0) {
        iVar9 = 0;
      }
      else {
        iVar9 = sqlite3BtreeCommitPhaseTwo(pBVar5,0);
      }
      lVar17 = lVar17 + 0x20;
      if (iVar9 != 0) {
        return iVar9;
      }
    }
LAB_00136148:
    callFinaliser(db,0x80);
    return 0;
  }
  if (uVar2 == '\0') {
    pcVar14 = pPVar6->zFilename;
  }
  else {
    pcVar14 = (char *)((long)&sqlite3PagerFilename_zFake + 4);
  }
  pVfs = db->pVfs;
  local_50 = (sqlite3_file *)0x0;
  if (pcVar14 == (char *)0x0) {
    uVar15 = 0;
  }
  else {
    sVar13 = strlen(pcVar14);
    uVar15 = (ulong)((uint)sVar13 & 0x3fffffff);
  }
  pcVar14 = sqlite3MPrintf(db,"%.4c%s%.16c",0,pcVar14);
  if (pcVar14 == (char *)0x0) {
    return 7;
  }
  zFile = pcVar14 + 4;
  iVar9 = 0;
  do {
    if (iVar9 == 0) {
LAB_00135df8:
      iVar9 = iVar9 + 1;
      sqlite3_randomness(4,&local_40);
      sqlite3_snprintf(0xd,pcVar14 + uVar15 + 4,"-mj%06X9%02X",(ulong)(local_40 >> 8));
      iVar10 = (*pVfs->xAccess)(pVfs,zFile,0,&local_3c);
      bVar18 = true;
    }
    else {
      if (iVar9 < 0x65) {
        if (iVar9 == 1) {
          sqlite3_log(0xd,"MJ collide: %s",zFile);
        }
        goto LAB_00135df8;
      }
      sqlite3_log(0xd,"MJ delete: %s",zFile);
      if (pVfs->xDelete != (_func_int_sqlite3_vfs_ptr_char_ptr_int *)0x0) {
        (*pVfs->xDelete)(pVfs,zFile,0);
      }
      bVar18 = false;
      iVar10 = 0;
    }
  } while (((bVar18) && (iVar10 == 0)) && (local_3c != 0));
  if (iVar10 == 0) {
    iVar10 = sqlite3OsOpenMalloc(pVfs,zFile,&local_50,0x4016,(int *)0x0);
  }
  if (iVar10 == 0) {
    if (db->nDb < 1) {
      iVar10 = 0;
    }
    else {
      lVar16 = 0;
      lVar17 = 8;
      local_38 = local_50;
      iVar10 = 0;
      local_60 = 0;
      do {
        lVar7 = *(long *)((long)&db->aDb->zDbSName + lVar17);
        if ((lVar7 == 0) || (*(char *)(lVar7 + 0x10) != '\x02')) {
          iVar11 = 0;
          iVar9 = iVar10;
        }
        else {
          __s = *(char **)(**(long **)(lVar7 + 8) + 0xe0);
          if (__s == (char *)0x0) {
            iVar11 = 0xf;
            iVar9 = local_48;
          }
          else {
            sVar13 = strlen(__s);
            psVar8 = local_38;
            local_44 = (*local_38->pMethods->xWrite)
                                 (local_38,__s,((uint)sVar13 & 0x3fffffff) + 1,local_60);
            sVar13 = strlen(__s);
            iVar10 = local_44;
            local_60 = local_60 + (ulong)((uint)sVar13 & 0x3fffffff) + 1;
            if (local_44 == 0) {
              iVar11 = 0;
              iVar10 = 0;
              iVar9 = 0;
            }
            else {
              if (psVar8->pMethods != (sqlite3_io_methods *)0x0) {
                (*psVar8->pMethods->xClose)(psVar8);
                psVar8->pMethods = (sqlite3_io_methods *)0x0;
              }
              sqlite3_free(psVar8);
              if (pVfs->xDelete != (_func_int_sqlite3_vfs_ptr_char_ptr_int *)0x0) {
                (*pVfs->xDelete)(pVfs,zFile,0);
              }
              sqlite3DbFreeNN(db,pcVar14);
              iVar11 = 1;
              local_48 = iVar10;
              iVar9 = iVar10;
            }
          }
        }
        if ((iVar11 != 0xf) && (iVar11 != 0)) {
          return iVar9;
        }
        lVar16 = lVar16 + 1;
        lVar17 = lVar17 + 0x20;
      } while (lVar16 < db->nDb);
    }
    psVar8 = local_50;
    if ((local_50->pMethods == (sqlite3_io_methods *)0x0) ||
       (uVar12 = (*local_50->pMethods->xDeviceCharacteristics)(local_50), (uVar12 >> 10 & 1) == 0))
    {
      iVar10 = (*psVar8->pMethods->xSync)(psVar8,2);
      if (iVar10 != 0) {
        if (psVar8->pMethods != (sqlite3_io_methods *)0x0) {
          (*psVar8->pMethods->xClose)(psVar8);
          psVar8->pMethods = (sqlite3_io_methods *)0x0;
        }
        sqlite3_free(psVar8);
        if (pVfs->xDelete != (_func_int_sqlite3_vfs_ptr_char_ptr_int *)0x0) {
          (*pVfs->xDelete)(pVfs,zFile,0);
        }
        goto LAB_00135e7a;
      }
      iVar10 = 0;
    }
    bVar18 = iVar10 == 0;
    if ((bVar18) && (0 < db->nDb)) {
      lVar16 = 8;
      lVar17 = 0;
      do {
        pBVar5 = *(Btree **)((long)&db->aDb->zDbSName + lVar16);
        iVar10 = 0;
        if (pBVar5 != (Btree *)0x0) {
          iVar10 = sqlite3BtreeCommitPhaseOne(pBVar5,zFile);
        }
        bVar18 = iVar10 == 0;
        if (!bVar18) break;
        lVar17 = lVar17 + 1;
        lVar16 = lVar16 + 0x20;
      } while (lVar17 < db->nDb);
    }
    if (psVar8->pMethods != (sqlite3_io_methods *)0x0) {
      (*psVar8->pMethods->xClose)(psVar8);
      psVar8->pMethods = (sqlite3_io_methods *)0x0;
    }
    sqlite3_free(psVar8);
    if (bVar18) {
      if (pVfs->xDelete == (_func_int_sqlite3_vfs_ptr_char_ptr_int *)0x0) {
        iVar9 = 0;
      }
      else {
        iVar9 = (*pVfs->xDelete)(pVfs,zFile,1);
      }
      sqlite3DbFreeNN(db,pcVar14);
      if (iVar9 != 0) {
        return iVar9;
      }
      if (sqlite3Hooks_0 != (code *)0x0) {
        (*sqlite3Hooks_0)();
      }
      if (0 < db->nDb) {
        lVar16 = 8;
        lVar17 = 0;
        do {
          pBVar5 = *(Btree **)((long)&db->aDb->zDbSName + lVar16);
          if (pBVar5 != (Btree *)0x0) {
            sqlite3BtreeCommitPhaseTwo(pBVar5,1);
          }
          lVar17 = lVar17 + 1;
          lVar16 = lVar16 + 0x20;
        } while (lVar17 < db->nDb);
      }
      if (sqlite3Hooks_1 != (code *)0x0) {
        (*sqlite3Hooks_1)();
      }
      goto LAB_00136148;
    }
  }
LAB_00135e7a:
  sqlite3DbFreeNN(db,pcVar14);
  return iVar10;
}

Assistant:

static int vdbeCommit(sqlite3 *db, Vdbe *p){
  int i;
  int nTrans = 0;  /* Number of databases with an active write-transaction
                   ** that are candidates for a two-phase commit using a
                   ** super-journal */
  int rc = SQLITE_OK;
  int needXcommit = 0;

#ifdef SQLITE_OMIT_VIRTUALTABLE
  /* With this option, sqlite3VtabSync() is defined to be simply
  ** SQLITE_OK so p is not used.
  */
  UNUSED_PARAMETER(p);
#endif

  /* Before doing anything else, call the xSync() callback for any
  ** virtual module tables written in this transaction. This has to
  ** be done before determining whether a super-journal file is
  ** required, as an xSync() callback may add an attached database
  ** to the transaction.
  */
  rc = sqlite3VtabSync(db, p);

  /* This loop determines (a) if the commit hook should be invoked and
  ** (b) how many database files have open write transactions, not
  ** including the temp database. (b) is important because if more than
  ** one database file has an open write transaction, a super-journal
  ** file is required for an atomic commit.
  */
  for(i=0; rc==SQLITE_OK && i<db->nDb; i++){
    Btree *pBt = db->aDb[i].pBt;
    if( sqlite3BtreeTxnState(pBt)==SQLITE_TXN_WRITE ){
      /* Whether or not a database might need a super-journal depends upon
      ** its journal mode (among other things).  This matrix determines which
      ** journal modes use a super-journal and which do not */
      static const u8 aMJNeeded[] = {
        /* DELETE   */  1,
        /* PERSIST   */ 1,
        /* OFF       */ 0,
        /* TRUNCATE  */ 1,
        /* MEMORY    */ 0,
        /* WAL       */ 0
      };
      Pager *pPager;   /* Pager associated with pBt */
      needXcommit = 1;
      sqlite3BtreeEnter(pBt);
      pPager = sqlite3BtreePager(pBt);
      if( db->aDb[i].safety_level!=PAGER_SYNCHRONOUS_OFF
       && aMJNeeded[sqlite3PagerGetJournalMode(pPager)]
       && sqlite3PagerIsMemdb(pPager)==0
      ){
        assert( i!=1 );
        nTrans++;
      }
      rc = sqlite3PagerExclusiveLock(pPager);
      sqlite3BtreeLeave(pBt);
    }
  }
  if( rc!=SQLITE_OK ){
    return rc;
  }

  /* If there are any write-transactions at all, invoke the commit hook */
  if( needXcommit && db->xCommitCallback ){
    rc = db->xCommitCallback(db->pCommitArg);
    if( rc ){
      return SQLITE_CONSTRAINT_COMMITHOOK;
    }
  }

  /* The simple case - no more than one database file (not counting the
  ** TEMP database) has a transaction active.   There is no need for the
  ** super-journal.
  **
  ** If the return value of sqlite3BtreeGetFilename() is a zero length
  ** string, it means the main database is :memory: or a temp file.  In
  ** that case we do not support atomic multi-file commits, so use the
  ** simple case then too.
  */
  if( 0==sqlite3Strlen30(sqlite3BtreeGetFilename(db->aDb[0].pBt))
   || nTrans<=1
  ){
    for(i=0; rc==SQLITE_OK && i<db->nDb; i++){
      Btree *pBt = db->aDb[i].pBt;
      if( pBt ){
        rc = sqlite3BtreeCommitPhaseOne(pBt, 0);
      }
    }

    /* Do the commit only if all databases successfully complete phase 1.
    ** If one of the BtreeCommitPhaseOne() calls fails, this indicates an
    ** IO error while deleting or truncating a journal file. It is unlikely,
    ** but could happen. In this case abandon processing and return the error.
    */
    for(i=0; rc==SQLITE_OK && i<db->nDb; i++){
      Btree *pBt = db->aDb[i].pBt;
      if( pBt ){
        rc = sqlite3BtreeCommitPhaseTwo(pBt, 0);
      }
    }
    if( rc==SQLITE_OK ){
      sqlite3VtabCommit(db);
    }
  }

  /* The complex case - There is a multi-file write-transaction active.
  ** This requires a super-journal file to ensure the transaction is
  ** committed atomically.
  */
#ifndef SQLITE_OMIT_DISKIO
  else{
    sqlite3_vfs *pVfs = db->pVfs;
    char *zSuper = 0;   /* File-name for the super-journal */
    char const *zMainFile = sqlite3BtreeGetFilename(db->aDb[0].pBt);
    sqlite3_file *pSuperJrnl = 0;
    i64 offset = 0;
    int res;
    int retryCount = 0;
    int nMainFile;

    /* Select a super-journal file name */
    nMainFile = sqlite3Strlen30(zMainFile);
    zSuper = sqlite3MPrintf(db, "%.4c%s%.16c", 0,zMainFile,0);
    if( zSuper==0 ) return SQLITE_NOMEM_BKPT;
    zSuper += 4;
    do {
      u32 iRandom;
      if( retryCount ){
        if( retryCount>100 ){
          sqlite3_log(SQLITE_FULL, "MJ delete: %s", zSuper);
          sqlite3OsDelete(pVfs, zSuper, 0);
          break;
        }else if( retryCount==1 ){
          sqlite3_log(SQLITE_FULL, "MJ collide: %s", zSuper);
        }
      }
      retryCount++;
      sqlite3_randomness(sizeof(iRandom), &iRandom);
      sqlite3_snprintf(13, &zSuper[nMainFile], "-mj%06X9%02X",
                               (iRandom>>8)&0xffffff, iRandom&0xff);
      /* The antipenultimate character of the super-journal name must
      ** be "9" to avoid name collisions when using 8+3 filenames. */
      assert( zSuper[sqlite3Strlen30(zSuper)-3]=='9' );
      sqlite3FileSuffix3(zMainFile, zSuper);
      rc = sqlite3OsAccess(pVfs, zSuper, SQLITE_ACCESS_EXISTS, &res);
    }while( rc==SQLITE_OK && res );
    if( rc==SQLITE_OK ){
      /* Open the super-journal. */
      rc = sqlite3OsOpenMalloc(pVfs, zSuper, &pSuperJrnl,
          SQLITE_OPEN_READWRITE|SQLITE_OPEN_CREATE|
          SQLITE_OPEN_EXCLUSIVE|SQLITE_OPEN_SUPER_JOURNAL, 0
      );
    }
    if( rc!=SQLITE_OK ){
      sqlite3DbFree(db, zSuper-4);
      return rc;
    }

    /* Write the name of each database file in the transaction into the new
    ** super-journal file. If an error occurs at this point close
    ** and delete the super-journal file. All the individual journal files
    ** still have 'null' as the super-journal pointer, so they will roll
    ** back independently if a failure occurs.
    */
    for(i=0; i<db->nDb; i++){
      Btree *pBt = db->aDb[i].pBt;
      if( sqlite3BtreeTxnState(pBt)==SQLITE_TXN_WRITE ){
        char const *zFile = sqlite3BtreeGetJournalname(pBt);
        if( zFile==0 ){
          continue;  /* Ignore TEMP and :memory: databases */
        }
        assert( zFile[0]!=0 );
        rc = sqlite3OsWrite(pSuperJrnl, zFile, sqlite3Strlen30(zFile)+1,offset);
        offset += sqlite3Strlen30(zFile)+1;
        if( rc!=SQLITE_OK ){
          sqlite3OsCloseFree(pSuperJrnl);
          sqlite3OsDelete(pVfs, zSuper, 0);
          sqlite3DbFree(db, zSuper-4);
          return rc;
        }
      }
    }

    /* Sync the super-journal file. If the IOCAP_SEQUENTIAL device
    ** flag is set this is not required.
    */
    if( 0==(sqlite3OsDeviceCharacteristics(pSuperJrnl)&SQLITE_IOCAP_SEQUENTIAL)
     && SQLITE_OK!=(rc = sqlite3OsSync(pSuperJrnl, SQLITE_SYNC_NORMAL))
    ){
      sqlite3OsCloseFree(pSuperJrnl);
      sqlite3OsDelete(pVfs, zSuper, 0);
      sqlite3DbFree(db, zSuper-4);
      return rc;
    }

    /* Sync all the db files involved in the transaction. The same call
    ** sets the super-journal pointer in each individual journal. If
    ** an error occurs here, do not delete the super-journal file.
    **
    ** If the error occurs during the first call to
    ** sqlite3BtreeCommitPhaseOne(), then there is a chance that the
    ** super-journal file will be orphaned. But we cannot delete it,
    ** in case the super-journal file name was written into the journal
    ** file before the failure occurred.
    */
    for(i=0; rc==SQLITE_OK && i<db->nDb; i++){
      Btree *pBt = db->aDb[i].pBt;
      if( pBt ){
        rc = sqlite3BtreeCommitPhaseOne(pBt, zSuper);
      }
    }
    sqlite3OsCloseFree(pSuperJrnl);
    assert( rc!=SQLITE_BUSY );
    if( rc!=SQLITE_OK ){
      sqlite3DbFree(db, zSuper-4);
      return rc;
    }

    /* Delete the super-journal file. This commits the transaction. After
    ** doing this the directory is synced again before any individual
    ** transaction files are deleted.
    */
    rc = sqlite3OsDelete(pVfs, zSuper, 1);
    sqlite3DbFree(db, zSuper-4);
    zSuper = 0;
    if( rc ){
      return rc;
    }

    /* All files and directories have already been synced, so the following
    ** calls to sqlite3BtreeCommitPhaseTwo() are only closing files and
    ** deleting or truncating journals. If something goes wrong while
    ** this is happening we don't really care. The integrity of the
    ** transaction is already guaranteed, but some stray 'cold' journals
    ** may be lying around. Returning an error code won't help matters.
    */
    disable_simulated_io_errors();
    sqlite3BeginBenignMalloc();
    for(i=0; i<db->nDb; i++){
      Btree *pBt = db->aDb[i].pBt;
      if( pBt ){
        sqlite3BtreeCommitPhaseTwo(pBt, 1);
      }
    }
    sqlite3EndBenignMalloc();
    enable_simulated_io_errors();

    sqlite3VtabCommit(db);
  }
#endif

  return rc;
}